

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O1

xr_surface * __thiscall xray_re::xr_object::attach(xr_object *this,xr_raw_surface *raw_surface)

{
  pointer *pppxVar1;
  iterator __position;
  int iVar2;
  mapped_type *__args;
  _func_int **pp_Var3;
  undefined4 extraout_var;
  xr_object *pxVar5;
  xr_surface *pxVar4;
  
  __args = std::__detail::
           _Map_base<xray_re::xr_raw_surface,_std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>,_std::__detail::_Select1st,_std::equal_to<xray_re::xr_raw_surface>,_std::hash<xray_re::xr_raw_surface>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<xray_re::xr_raw_surface,_std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>,_std::__detail::_Select1st,_std::equal_to<xray_re::xr_raw_surface>,_std::hash<xray_re::xr_raw_surface>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_raw_surfaces,raw_surface);
  if (*__args == (mapped_type)0x0) {
    pxVar5 = (xr_object *)this->m_surface_factory;
    if (pxVar5 == (xr_object *)0x0) {
      pp_Var3 = (this->super_xr_surface_factory)._vptr_xr_surface_factory;
      pxVar5 = this;
    }
    else {
      pp_Var3 = (pxVar5->super_xr_surface_factory)._vptr_xr_surface_factory;
    }
    iVar2 = (*pp_Var3[2])(pxVar5,raw_surface);
    pxVar4 = (xr_surface *)CONCAT44(extraout_var,iVar2);
    *__args = pxVar4;
    if (pxVar4 == (xr_surface *)0x0) {
      __assert_fail("surface",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                    ,0x1b3,"xr_surface *xray_re::xr_object::attach(const xr_raw_surface &)");
    }
    __position._M_current =
         (this->m_surfaces).
         super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_surfaces).
        super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>::
      _M_realloc_insert<xray_re::xr_surface*const&>
                ((vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>> *)
                 &this->m_surfaces,__position,__args);
    }
    else {
      *__position._M_current = pxVar4;
      pppxVar1 = &(this->m_surfaces).
                  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppxVar1 = *pppxVar1 + 1;
    }
  }
  return *__args;
}

Assistant:

xr_surface* xr_object::attach(const xr_raw_surface& raw_surface)
{
	xr_surface*& surface = m_raw_surfaces[raw_surface];
	if (surface == 0) {
		surface = m_surface_factory ?
				m_surface_factory->create_surface(raw_surface) :
				create_surface(raw_surface);
		xr_assert(surface);
		m_surfaces.push_back(surface);
	}
	return surface;
}